

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O1

cf_hashtbl_t * cf_hashtbl_new(cf_size_t size,cf_hashtbl_cb_f value_cb)

{
  ulong uVar1;
  cf_hashtbl_t *__ptr;
  ulong uVar2;
  hashtbl_node_t **pphVar3;
  
  __ptr = (cf_hashtbl_t *)calloc(1,0x20);
  if (__ptr != (cf_hashtbl_t *)0x0) {
    uVar1 = 8;
    do {
      uVar2 = uVar1;
      uVar1 = uVar2 * 2;
    } while (uVar1 < size);
    __ptr->hashmsk = (int)uVar1 - 1;
    __ptr->size = 0;
    pphVar3 = (hashtbl_node_t **)calloc(1,uVar2 << 4);
    __ptr->table = pphVar3;
    __ptr->callback = value_cb;
    if (pphVar3 != (hashtbl_node_t **)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (cf_hashtbl_t *)0x0;
}

Assistant:

cf_hashtbl_t* cf_hashtbl_new(cf_size_t size, cf_hashtbl_cb_f value_cb) {
    cf_size_t init_size = 8;
    cf_hashtbl_t* tbl = CF_NULL_PTR;

    tbl = cf_malloc_z_native(sizeof(cf_hashtbl_t));
    if (!tbl) {
        return CF_NULL_PTR;
    }

    do { init_size <<= 1; } while (init_size < size);
    init_size -= 1;
    
    tbl->hashmsk = init_size;
    tbl->size = 0;
    tbl->table = cf_malloc_z_native(sizeof(hashtbl_node_t*) * (init_size + 1));
    tbl->callback = value_cb;
    if (!tbl->table) {
        cf_free_native(tbl);
        return CF_NULL_PTR;
    }
    return tbl;
}